

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int ffgtdc(int grouptype,int xtensioncol,int extnamecol,int extvercol,int positioncol,
          int locationcol,int uricol,char **ttype,char **tform,int *ncols,int *status)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  undefined4 in_EDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  char locTform [5];
  char location [16];
  int *in_stack_00000020;
  int *in_stack_00000028;
  char URITform [3];
  char URI [16];
  char posTform [3];
  char position [16];
  char verTform [3];
  char version [15];
  char nameTform [4];
  char name [12];
  char xtenTform [3];
  char xtension [16];
  int i;
  char local_bd [34];
  char local_9b [32];
  char local_7b [30];
  char local_5d [61];
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_4;
  
  local_20 = 0;
  local_5d[0x25] = 'M';
  local_5d[0x26] = 'E';
  local_5d[0x27] = 'M';
  local_5d[0x28] = 'B';
  local_5d[0x29] = 'E';
  local_5d[0x2a] = 'R';
  local_5d[0x2b] = '_';
  local_5d[0x2c] = 'X';
  local_5d[0x2d] = 'T';
  local_5d[0x2e] = 'E';
  local_5d[0x2f] = 'N';
  local_5d[0x30] = 'S';
  local_5d[0x31] = 'I';
  local_5d[0x32] = 'O';
  local_5d[0x33] = 'N';
  local_5d[0x34] = '\0';
  local_5d[0x22] = '8';
  local_5d[0x23] = 'A';
  local_5d[0x24] = 0;
  local_5d[0x16] = 'M';
  local_5d[0x17] = 'E';
  local_5d[0x18] = 'M';
  local_5d[0x19] = 'B';
  local_5d[0x1a] = 'E';
  local_5d[0x1b] = 'R';
  local_5d[0x1c] = '_';
  local_5d[0x1d] = 'N';
  local_5d[0x1e] = 'A';
  local_5d[0x1f] = 'M';
  local_5d[0x20] = 'E';
  local_5d[0x21] = '\0';
  local_5d[0x12] = '3';
  local_5d[0x13] = '2';
  local_5d[0x14] = 'A';
  local_5d[0x15] = '\0';
  local_5d[3] = 'M';
  local_5d[4] = 'E';
  local_5d[5] = 'M';
  local_5d[6] = 'B';
  local_5d[7] = 'E';
  local_5d[8] = 'R';
  local_5d[9] = '_';
  local_5d[10] = 'V';
  local_5d[0xb] = 'E';
  local_5d[0xc] = 'R';
  local_5d[0xd] = 'S';
  local_5d[0xe] = 'I';
  local_5d[0xf] = 'O';
  local_5d[0x10] = 'N';
  local_5d[0x11] = 0;
  local_5d[0] = '1';
  local_5d[1] = 'J';
  local_5d[2] = 0;
  local_7b[3] = 'M';
  local_7b[4] = 'E';
  local_7b[5] = 'M';
  local_7b[6] = 'B';
  local_7b[7] = 'E';
  local_7b[8] = 'R';
  local_7b[9] = '_';
  local_7b[10] = 'P';
  local_7b[0xb] = 'O';
  local_7b[0xc] = 'S';
  local_7b[0xd] = 'I';
  local_7b[0xe] = 'T';
  local_7b[0xf] = 'I';
  local_7b[0x10] = 'O';
  local_7b[0x11] = 'N';
  local_7b[0x12] = '\0';
  local_7b[0] = '1';
  local_7b[1] = 'J';
  local_7b[2] = 0;
  local_9b[3] = 'M';
  local_9b[4] = 'E';
  local_9b[5] = 'M';
  local_9b[6] = 'B';
  local_9b[7] = 'E';
  local_9b[8] = 'R';
  local_9b[9] = '_';
  local_9b[10] = 'U';
  local_9b[0xb] = 'R';
  local_9b[0xc] = 'I';
  local_9b[0xd] = '_';
  local_9b[0xe] = 'T';
  local_9b[0xf] = 'Y';
  local_9b[0x10] = 'P';
  local_9b[0x11] = 'E';
  local_9b[0x12] = '\0';
  local_9b[0] = '3';
  local_9b[1] = 'A';
  local_9b[2] = 0;
  builtin_strncpy(local_bd + 5,"MEMBER_LOCATION",0x10);
  builtin_strncpy(local_bd,"256A",5);
  if (*in_stack_00000028 == 0) {
    local_1c = in_R9D;
    local_18 = in_R8D;
    local_14 = in_ECX;
    local_10 = in_EDX;
    switch(in_EDI) {
    case 0:
      if (in_ESI == 0) {
        strcpy(*(char **)location._0_8_,local_5d + 0x25);
        strcpy(*(char **)(location._8_8_ + (long)local_20 * 8),local_5d + 0x22);
        local_20 = local_20 + 1;
      }
      if (local_10 == 0) {
        strcpy(*(char **)(location._0_8_ + (long)local_20 * 8),local_5d + 0x16);
        strcpy(*(char **)(location._8_8_ + (long)local_20 * 8),local_5d + 0x12);
        local_20 = local_20 + 1;
      }
      if (local_14 == 0) {
        strcpy(*(char **)(location._0_8_ + (long)local_20 * 8),local_5d + 3);
        strcpy(*(char **)(location._8_8_ + (long)local_20 * 8),local_5d);
        local_20 = local_20 + 1;
      }
      if (local_18 == 0) {
        strcpy(*(char **)(location._0_8_ + (long)local_20 * 8),local_7b + 3);
        strcpy(*(char **)(location._8_8_ + (long)local_20 * 8),local_7b);
        local_20 = local_20 + 1;
      }
      if (local_1c == 0) {
        strcpy(*(char **)(location._0_8_ + (long)local_20 * 8),local_bd + 5);
        strcpy(*(char **)(location._8_8_ + (long)local_20 * 8),local_bd);
        local_20 = local_20 + 1;
      }
      if (in_stack_00000008 == 0) {
        strcpy(*(char **)(location._0_8_ + (long)local_20 * 8),local_9b + 3);
        strcpy(*(char **)(location._8_8_ + (long)local_20 * 8),local_9b);
        local_20 = local_20 + 1;
      }
      break;
    case 1:
      if (in_ESI == 0) {
        strcpy(*(char **)location._0_8_,local_5d + 0x25);
        strcpy(*(char **)(location._8_8_ + (long)local_20 * 8),local_5d + 0x22);
        local_20 = local_20 + 1;
      }
      if (local_10 == 0) {
        strcpy(*(char **)(location._0_8_ + (long)local_20 * 8),local_5d + 0x16);
        strcpy(*(char **)(location._8_8_ + (long)local_20 * 8),local_5d + 0x12);
        local_20 = local_20 + 1;
      }
      if (local_14 == 0) {
        strcpy(*(char **)(location._0_8_ + (long)local_20 * 8),local_5d + 3);
        strcpy(*(char **)(location._8_8_ + (long)local_20 * 8),local_5d);
        local_20 = local_20 + 1;
      }
      break;
    case 2:
      if (in_R8D == 0) {
        strcpy(*(char **)location._0_8_,local_7b + 3);
        strcpy(*(char **)(location._8_8_ + (long)local_20 * 8),local_7b);
        local_20 = local_20 + 1;
      }
      break;
    case 3:
      if (in_ESI == 0) {
        strcpy(*(char **)location._0_8_,local_5d + 0x25);
        strcpy(*(char **)(location._8_8_ + (long)local_20 * 8),local_5d + 0x22);
        local_20 = local_20 + 1;
      }
      if (local_10 == 0) {
        strcpy(*(char **)(location._0_8_ + (long)local_20 * 8),local_5d + 0x16);
        strcpy(*(char **)(location._8_8_ + (long)local_20 * 8),local_5d + 0x12);
        local_20 = local_20 + 1;
      }
      if (local_14 == 0) {
        strcpy(*(char **)(location._0_8_ + (long)local_20 * 8),local_5d + 3);
        strcpy(*(char **)(location._8_8_ + (long)local_20 * 8),local_5d);
        local_20 = local_20 + 1;
      }
      if (local_18 == 0) {
        strcpy(*(char **)(location._0_8_ + (long)local_20 * 8),local_7b + 3);
        strcpy(*(char **)(location._8_8_ + (long)local_20 * 8),local_7b);
        local_20 = local_20 + 1;
      }
      break;
    default:
      *in_stack_00000028 = 0x15b;
      ffpmsg((char *)0x1cf77e);
      break;
    case 0xb:
      if (in_ESI == 0) {
        strcpy(*(char **)location._0_8_,local_5d + 0x25);
        strcpy(*(char **)(location._8_8_ + (long)local_20 * 8),local_5d + 0x22);
        local_20 = local_20 + 1;
      }
      if (local_10 == 0) {
        strcpy(*(char **)(location._0_8_ + (long)local_20 * 8),local_5d + 0x16);
        strcpy(*(char **)(location._8_8_ + (long)local_20 * 8),local_5d + 0x12);
        local_20 = local_20 + 1;
      }
      if (local_14 == 0) {
        strcpy(*(char **)(location._0_8_ + (long)local_20 * 8),local_5d + 3);
        strcpy(*(char **)(location._8_8_ + (long)local_20 * 8),local_5d);
        local_20 = local_20 + 1;
      }
      if (local_1c == 0) {
        strcpy(*(char **)(location._0_8_ + (long)local_20 * 8),local_bd + 5);
        strcpy(*(char **)(location._8_8_ + (long)local_20 * 8),local_bd);
        local_20 = local_20 + 1;
      }
      if (in_stack_00000008 == 0) {
        strcpy(*(char **)(location._0_8_ + (long)local_20 * 8),local_9b + 3);
        strcpy(*(char **)(location._8_8_ + (long)local_20 * 8),local_9b);
        local_20 = local_20 + 1;
      }
      break;
    case 0xc:
      if (in_R8D == 0) {
        strcpy(*(char **)location._0_8_,local_7b + 3);
        strcpy(*(char **)(location._8_8_ + (long)local_20 * 8),local_7b);
        local_20 = local_20 + 1;
      }
      if (local_1c == 0) {
        strcpy(*(char **)(location._0_8_ + (long)local_20 * 8),local_bd + 5);
        strcpy(*(char **)(location._8_8_ + (long)local_20 * 8),local_bd);
        local_20 = local_20 + 1;
      }
      if (in_stack_00000008 == 0) {
        strcpy(*(char **)(location._0_8_ + (long)local_20 * 8),local_9b + 3);
        strcpy(*(char **)(location._8_8_ + (long)local_20 * 8),local_9b);
        local_20 = local_20 + 1;
      }
    }
    *in_stack_00000020 = local_20;
    local_4 = *in_stack_00000028;
  }
  else {
    local_4 = *in_stack_00000028;
  }
  return local_4;
}

Assistant:

int ffgtdc(int   grouptype,     /* code specifying the type of
				   grouping table information:
				   GT_ID_ALL_URI  0 ==> defualt (all columns)
				   GT_ID_REF      1 ==> ID by reference
				   GT_ID_POS      2 ==> ID by position
				   GT_ID_ALL      3 ==> ID by ref. and position
				   GT_ID_REF_URI 11 ==> (1) + URI info 
				   GT_ID_POS_URI 12 ==> (2) + URI info       */
	   int   xtensioncol, /* does MEMBER_XTENSION already exist?         */
	   int   extnamecol,  /* does MEMBER_NAME aleady exist?              */
	   int   extvercol,   /* does MEMBER_VERSION already exist?          */
	   int   positioncol, /* does MEMBER_POSITION already exist?         */
	   int   locationcol, /* does MEMBER_LOCATION already exist?         */
	   int   uricol,      /* does MEMBER_URI_TYPE aleardy exist?         */
	   char *ttype[],     /* array of grouping table column TTYPE names
				 to define (if *col var false)               */
	   char *tform[],     /* array of grouping table column TFORM values
				 to define (if*col variable false)           */
	   int  *ncols,       /* number of TTYPE and TFORM values returned   */
	   int  *status)      /* return status code                          */

/*
  create the TTYPE and TFORM values for the grouping table according to the
  value of the grouptype parameter and the values of the *col flags. The
  resulting TTYPE and TFORM are returned in ttype[] and tform[] respectively.
  The number of TTYPE and TFORMs returned is given by ncols. Both the TTYPE[]
  and TTFORM[] arrays must contain enough pre-allocated strings to hold
  the returned information.
*/

{

  int i = 0;

  char  xtension[]  = "MEMBER_XTENSION";
  char  xtenTform[] = "8A";
  
  char  name[]      = "MEMBER_NAME";
  char  nameTform[] = "32A";

  char  version[]   = "MEMBER_VERSION";
  char  verTform[]  = "1J";
  
  char  position[]  = "MEMBER_POSITION";
  char  posTform[]  = "1J";

  char  URI[]       = "MEMBER_URI_TYPE";
  char  URITform[]  = "3A";

  char  location[]  = "MEMBER_LOCATION";
  /* SPR 01720, move from 160A to 256A */
  char  locTform[]  = "256A";


  if(*status != 0) return(*status);

  switch(grouptype)
    {
      
    case GT_ID_ALL_URI:

      if(xtensioncol == 0)
	{
	  strcpy(ttype[i],xtension);
	  strcpy(tform[i],xtenTform);
	  ++i;
	}
      if(extnamecol == 0)
	{
	  strcpy(ttype[i],name);
	  strcpy(tform[i],nameTform);
	  ++i;
	}
      if(extvercol == 0)
	{
	  strcpy(ttype[i],version);
	  strcpy(tform[i],verTform);
	  ++i;
	}
      if(positioncol == 0)
	{
	  strcpy(ttype[i],position);
	  strcpy(tform[i],posTform);
	  ++i;
	}
      if(locationcol == 0)
	{
	  strcpy(ttype[i],location);
	  strcpy(tform[i],locTform);
	  ++i;
	}
      if(uricol == 0)
	{
	  strcpy(ttype[i],URI);
	  strcpy(tform[i],URITform);
	  ++i;
	}
      break;
      
    case GT_ID_REF:
      
      if(xtensioncol == 0)
	{
	  strcpy(ttype[i],xtension);
	  strcpy(tform[i],xtenTform);
	  ++i;
	}
      if(extnamecol == 0)
	{
	  strcpy(ttype[i],name);
	  strcpy(tform[i],nameTform);
	  ++i;
	}
      if(extvercol == 0)
	{
	  strcpy(ttype[i],version);
	  strcpy(tform[i],verTform);
	  ++i;
	}
      break;
      
    case GT_ID_POS:
      
      if(positioncol == 0)
	{
	  strcpy(ttype[i],position);
	  strcpy(tform[i],posTform);
	  ++i;
	}	  
      break;
      
    case GT_ID_ALL:
      
      if(xtensioncol == 0)
	{
	  strcpy(ttype[i],xtension);
	  strcpy(tform[i],xtenTform);
	  ++i;
	}
      if(extnamecol == 0)
	{
	  strcpy(ttype[i],name);
	  strcpy(tform[i],nameTform);
	  ++i;
	}
      if(extvercol == 0)
	{
	  strcpy(ttype[i],version);
	  strcpy(tform[i],verTform);
	  ++i;
	}
      if(positioncol == 0)
	{
	  strcpy(ttype[i],position);
	  strcpy(tform[i], posTform);
	  ++i;
	}	  
      
      break;
      
    case GT_ID_REF_URI:
      
      if(xtensioncol == 0)
	{
	  strcpy(ttype[i],xtension);
	  strcpy(tform[i],xtenTform);
	  ++i;
	}
      if(extnamecol == 0)
	{
	  strcpy(ttype[i],name);
	  strcpy(tform[i],nameTform);
	  ++i;
	}
      if(extvercol == 0)
	{
	  strcpy(ttype[i],version);
	  strcpy(tform[i],verTform);
	  ++i;
	}
      if(locationcol == 0)
	{
	  strcpy(ttype[i],location);
	  strcpy(tform[i],locTform);
	  ++i;
	}
      if(uricol == 0)
	{
	  strcpy(ttype[i],URI);
	  strcpy(tform[i],URITform);
	  ++i;
	}
      break;
      
    case GT_ID_POS_URI:
      
      if(positioncol == 0)
	{
	  strcpy(ttype[i],position);
	  strcpy(tform[i],posTform);
	  ++i;
	}
      if(locationcol == 0)
	{
	  strcpy(ttype[i],location);
	  strcpy(tform[i],locTform);
	  ++i;
	}
      if(uricol == 0)
	{
	  strcpy(ttype[i],URI);
	  strcpy(tform[i],URITform);
	  ++i;
	}
      break;
      
    default:
      
      *status = BAD_OPTION;
      ffpmsg("Invalid value specified for the grouptype parameter (ffgtdc)");

      break;

    }

  *ncols = i;
  
  return(*status);
}